

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int wally_descriptor_to_address
              (char *descriptor,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t derive_child_num,uint32_t network,uint32_t flags,char **output)

{
  int iVar1;
  long lVar2;
  address_script_t *address_item;
  char **in_stack_ffffffffffffffa8;
  uint32_t network_local;
  wally_descriptor_script_item script_item;
  
  iVar1 = -2;
  if (output != (char **)0x0) {
    if (network == 0xff) {
      address_item = g_network_address_table + 2;
    }
    else {
      lVar2 = 0;
      do {
        if ((&g_network_address_table[0].network)[lVar2] == network) {
          address_item = (address_script_t *)(&g_network_address_table[0].network + lVar2);
          goto LAB_001671d3;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x50);
      address_item = (address_script_t *)0x0;
    }
LAB_001671d3:
    if (address_item != (address_script_t *)0x0) {
      network_local = network;
      wally_bzero(&script_item,0x18);
      script_item.child_num = derive_child_num;
      iVar1 = parse_miniscript(descriptor,key_name_array,key_value_array,array_len,flags,3,
                               &network_local,0,0,&script_item,1,(uint32_t *)0x0,
                               in_stack_ffffffffffffffa8);
      if (iVar1 == 0) {
        iVar1 = descriptor_scriptpubkey_to_address
                          (address_item,script_item.script,script_item.script_len,output);
      }
      if (script_item.script != (uchar *)0x0) {
        wally_bzero(script_item.script,script_item.script_len);
        wally_free(script_item.script);
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_descriptor_to_address(
    const char *descriptor,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t derive_child_num,
    uint32_t network,
    uint32_t flags,
    char **output)
{
    int ret;
    size_t index;
    size_t addr_tbl_max = sizeof(g_network_address_table) / sizeof(struct address_script_t);
    const struct address_script_t *addr_item = NULL;
    struct wally_descriptor_script_item script_item;

    if (!output)
        return WALLY_EINVAL;

    if (network == WALLY_NETWORK_BITCOIN_REGTEST)
        addr_item = &g_network_address_table[2];  /* bitcoin regtest */
    else
        for (index = 0; index < addr_tbl_max; ++index) {
            if (network == (uint32_t)g_network_address_table[index].network) {
                addr_item = &g_network_address_table[index];
                break;
            }
        }

    if (!addr_item)
        return WALLY_EINVAL;

    wally_bzero(&script_item, sizeof(script_item));
    script_item.child_num = derive_child_num;

    ret = parse_miniscript(
        descriptor,
        key_name_array,
        key_value_array,
        array_len,
        flags,
        DESCRIPTOR_KIND_MINISCRIPT | DESCRIPTOR_KIND_DESCRIPTOR,
        (!addr_item) ? NULL : &network,
        0,
        0,
        &script_item,
        1,
        NULL,
        NULL);
    if (ret == WALLY_OK)
        ret = descriptor_scriptpubkey_to_address(addr_item,
                                                 script_item.script,
                                                 script_item.script_len,
                                                 output);

    if (script_item.script) {
        wally_bzero((char *)script_item.script, script_item.script_len);
        wally_free(script_item.script);
    }
    return ret;
}